

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_u_tau(REF_DBL y,REF_DBL u,REF_DBL nu_mach_re,REF_DBL *u_tau)

{
  uint uVar1;
  int iVar2;
  REF_STATUS RVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  undefined8 in_XMM1_Qb;
  REF_DBL uplus_error;
  double local_a0;
  double local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_48;
  
  local_88 = u;
  if (u <= -u) {
    local_88 = -u;
  }
  local_98 = y;
  if (y <= -y) {
    local_98 = -y;
  }
  dVar6 = local_98 * 1e+20;
  if (dVar6 <= -dVar6) {
    dVar6 = -dVar6;
  }
  dVar7 = local_88;
  if (local_88 <= -local_88) {
    dVar7 = -local_88;
  }
  if (dVar6 <= dVar7) {
    *u_tau = nu_mach_re;
    RVar3 = 0;
  }
  else {
    dVar6 = (local_88 / local_98) * nu_mach_re;
    uStack_80 = in_XMM1_Qb;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (dVar6 <= local_88 / 30.0) {
      dVar6 = local_88 / 30.0;
    }
    *u_tau = dVar6;
    local_48 = local_98 / nu_mach_re;
    bVar5 = true;
    iVar2 = 100;
    do {
      if (!bVar5) {
        return 0;
      }
      dVar6 = *u_tau;
      local_58 = (local_98 * dVar6) / nu_mach_re;
      uVar1 = ref_phys_spalding_uplus(local_58,&local_a0);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x2da,"ref_phys_u_tau",(ulong)uVar1,"uplus");
        return uVar1;
      }
      local_78 = local_88 / dVar6;
      uStack_70 = uStack_80;
      local_a0 = local_a0 - local_78;
      uStack_60 = 0;
      local_68 = local_a0;
      dVar7 = exp(local_78 * 0.4);
      *u_tau = *u_tau - local_68 /
                        (local_88 / (dVar6 * dVar6) +
                        local_48 / ((dVar7 * 0.4 + -0.4) * 0.1108 + 1.0));
      dVar6 = local_78 * 1e+20;
      if (dVar6 <= -dVar6) {
        dVar6 = -dVar6;
      }
      dVar7 = local_68;
      if (local_68 <= -local_68) {
        dVar7 = -local_68;
      }
      if (dVar6 <= dVar7) {
LAB_001e4004:
        bVar5 = dVar7 == 1e-15;
        bVar4 = dVar7 < 1e-15;
      }
      else {
        dVar6 = local_78;
        if (local_78 <= -local_78) {
          dVar6 = -local_78;
        }
        if (dVar6 <= 0.001) goto LAB_001e4004;
        dVar6 = local_68 / local_78;
        if (dVar6 <= -dVar6) {
          dVar6 = -dVar6;
        }
        bVar5 = dVar6 == 1e-12;
        bVar4 = dVar6 < 1e-12;
      }
      bVar5 = !bVar4 && !bVar5;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2ef,
           "ref_phys_u_tau","iteration count exceeded");
    printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n",local_98,local_88,local_58,local_78,
           local_68,*u_tau);
    RVar3 = 1;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_phys_u_tau(REF_DBL y, REF_DBL u, REF_DBL nu_mach_re,
                                  REF_DBL *u_tau) {
  REF_DBL uplus, yplus;
  REF_DBL uplus_error;
  REF_DBL dyplus_duplus;
  REF_DBL uplus_error_du_tau;
  REF_DBL duplus_du_tau, dyplus_du_tau;
  REF_DBL du_tau;
  REF_BOOL keep_going;
  REF_INT iters;
  REF_BOOL verbose = REF_FALSE;
  u = ABS(u); /* only admit positive values */
  y = ABS(y);
  if (!ref_math_divisible(u, y)) {
    *u_tau = nu_mach_re;
    if (verbose) {
      uplus = u / (*u_tau);
      yplus = y * (*u_tau) / nu_mach_re;
      uplus_error = 0.0;
      printf("u_tau %e yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    }
    return REF_SUCCESS;
  }
  *u_tau = sqrt(u / y * nu_mach_re); /* guess to start newton */
  uplus = 30;                        /* edge of boundary layer guess */
  (*u_tau) = MAX((*u_tau), (u / uplus));
  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    uplus = u / (*u_tau);
    duplus_du_tau = -u / ((*u_tau) * (*u_tau));
    yplus = y * (*u_tau) / nu_mach_re;
    dyplus_du_tau = y / nu_mach_re;
    RSS(ref_phys_spalding_uplus(yplus, &uplus_error), "uplus");
    uplus_error -= uplus;
    RSS(ref_phys_spalding_dyplus_duplus(uplus, &dyplus_duplus),
        "dyplus_duplus");
    uplus_error_du_tau = dyplus_du_tau / dyplus_duplus - duplus_du_tau;
    du_tau = -uplus_error / uplus_error_du_tau;
    if (verbose)
      printf("u_tau %f yplus %f uplus %f error %e y %e\n", *u_tau, yplus, uplus,
             uplus_error, y);
    (*u_tau) += du_tau;

    if (ref_math_divisible(uplus_error, uplus) && ABS(uplus) > 1.0e-3) {
      keep_going = (ABS(uplus_error / uplus) > 1.0e-12);
    } else {
      keep_going = (ABS(uplus_error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded", {
      printf(" y %e u %e yplus %e uplus %e error %e u_tau %e\n", y, u, yplus,
             uplus, uplus_error, *u_tau);
    });
  }
  return REF_SUCCESS;
}